

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,short *scaleFactors)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  if (0 < this->kPatternCount) {
    lVar4 = 0;
    local_38 = scaleFactors;
    do {
      iVar1 = this->kPartialsPaddedStateCount;
      if (this->kCategoryCount < 1) {
        dVar7 = 0.0;
      }
      else {
        iVar3 = iVar1 * (int)lVar4;
        auVar8 = ZEXT1664(ZEXT816(0));
        iVar5 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar6 = 0;
            do {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = destP[iVar3 + lVar6];
              auVar9 = vmaxsd_avx(auVar9,auVar8._0_16_);
              auVar8 = ZEXT1664(auVar9);
              lVar6 = lVar6 + 1;
            } while (this->kStateCount != (int)lVar6);
          }
          dVar7 = auVar8._0_8_;
          iVar5 = iVar5 + 1;
          iVar3 = iVar3 + this->kPaddedPatternCount * iVar1;
        } while (iVar5 != this->kCategoryCount);
      }
      frexp(dVar7,&local_44);
      local_38[lVar4] = (short)local_44;
      local_40 = lVar4;
      if ((local_44 != 0) && (0 < this->kCategoryCount)) {
        iVar5 = -local_44;
        iVar3 = 0;
        do {
          if (0 < this->kStateCount) {
            iVar2 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar3 +
                    iVar1 * (int)lVar4;
            lVar6 = 0;
            do {
              dVar7 = ldexp(1.0,iVar5);
              destP[iVar2 + lVar6] = dVar7 * destP[iVar2 + lVar6];
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 < this->kStateCount);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->kCategoryCount);
      }
      lVar4 = local_40 + 1;
    } while (lVar4 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}